

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.c
# Opt level: O1

CURLcode socks_proxy_cf_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  uchar *puVar1;
  uchar uVar2;
  byte bVar3;
  connectdata *pcVar4;
  sockaddr *psVar5;
  _Bool _Var6;
  ushort uVar7;
  CURLcode CVar8;
  uint uVar9;
  int iVar10;
  resolve_t rVar11;
  connect_t cVar12;
  socks_state *sx;
  long lVar13;
  size_t __n;
  ssize_t sVar14;
  size_t __n_00;
  int code;
  ulong uVar15;
  Curl_addrinfo *pCVar16;
  char *pcVar17;
  char *pcVar18;
  CURLproxycode in_R8D;
  CURLproxycode CVar19;
  Curl_dns_entry **entry;
  size_t sVar20;
  ulong uVar21;
  bool bVar22;
  bool bVar23;
  Curl_dns_entry *dns;
  size_t local_98;
  Curl_cfilter *local_90;
  connectdata *local_88;
  _Bool *local_80;
  uchar ip4 [4];
  undefined4 uStack_74;
  undefined8 uStack_70;
  
  local_80 = done;
  if ((cf->field_0x24 & 1) != 0) {
    CVar8 = CURLE_OK;
    _Var6 = true;
    goto LAB_0072c210;
  }
  sx = (socks_state *)cf->ctx;
  pcVar4 = cf->conn;
  iVar10 = cf->sockindex;
  CVar8 = (*cf->next->cft->do_connect)(cf->next,data,blocking,done);
  if (CVar8 != CURLE_OK) {
    return CVar8;
  }
  if (*done != true) {
    return CURLE_OK;
  }
  local_90 = cf;
  local_88 = pcVar4;
  if (sx == (socks_state *)0x0) {
    sx = (socks_state *)(*Curl_ccalloc)(1,0x290);
    if (sx == (socks_state *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    cf->ctx = sx;
  }
  if (sx->state == CONNECT_INIT) {
    sx->state = CONNECT_SOCKS_INIT;
    lVar13 = 0xd8;
    if (((((uint)local_88->bits & 1) == 0) && (lVar13 = 0x80, ((uint)local_88->bits >> 9 & 1) == 0))
       && (lVar13 = 0x50, iVar10 == 1)) {
      lVar13 = 0x68;
    }
    sx->hostname = *(char **)((long)&(local_88->bundle_node).ptr + lVar13);
    if (((uint)local_88->bits & 1) == 0) {
      if (iVar10 == 1) {
        uVar9 = (uint)local_88->secondary_port;
      }
      else if (((uint)local_88->bits >> 10 & 1) == 0) {
        uVar9 = local_88->remote_port;
      }
      else {
        uVar9 = local_88->conn_to_port;
      }
    }
    else {
      uVar9 = (local_88->http_proxy).port;
    }
    sx->remote_port = uVar9;
    sx->proxy_user = (local_88->socks_proxy).user;
    sx->proxy_password = (local_88->socks_proxy).passwd;
  }
  pcVar4 = cf->conn;
  uVar2 = (pcVar4->socks_proxy).proxytype;
  switch(uVar2) {
  case '\x04':
  case '\x06':
    puVar1 = sx->buffer;
    dns = (Curl_dns_entry *)0x0;
    switch(sx->state) {
    case CONNECT_SOCKS_INIT:
      pcVar4->ip_version = '\x01';
      if (((data != (Curl_easy *)0x0) && (((uint)pcVar4->bits & 1) != 0)) &&
         (((data->set).field_0x8bd & 0x10) != 0)) {
        pcVar18 = "";
        if (uVar2 == '\x06') {
          pcVar18 = "a";
        }
        in_R8D = sx->remote_port;
        Curl_infof(data,"SOCKS4%s: connecting to HTTP proxy %s port %d",pcVar18,sx->hostname);
      }
      if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
        Curl_infof(data,"SOCKS4 communication to %s:%d",sx->hostname,(ulong)(uint)sx->remote_port);
      }
      iVar10 = sx->remote_port;
      uVar7 = (ushort)iVar10;
      sx->buffer[0] = '\x04';
      sx->buffer[1] = '\x01';
      *(ushort *)(sx->buffer + 2) = uVar7 << 8 | uVar7 >> 8;
      if (uVar2 == '\x06') {
        if (sx->state != CONNECT_REQ_INIT) {
          sx->state = CONNECT_REQ_INIT;
        }
        goto switchD_0072c2a3_caseD_9;
      }
      entry = &dns;
      rVar11 = Curl_resolv(data,sx->hostname,iVar10,true,entry);
      in_R8D = (CURLproxycode)entry;
      if (rVar11 == CURLRESOLV_ERROR) {
        in_R8D = CURLPX_RESOLVE_HOST;
        bVar22 = false;
      }
      else if (rVar11 == CURLRESOLV_PENDING) {
        if (sx->state != CONNECT_RESOLVING) {
          sx->state = CONNECT_RESOLVING;
        }
        bVar22 = false;
        if (data != (Curl_easy *)0x0) {
          in_R8D = CURLPX_OK;
          if (((data->set).field_0x8bd & 0x10) == 0) goto LAB_0072c75b;
          Curl_infof(data,"SOCKS4 non-blocking resolve of %s",sx->hostname);
        }
        bVar22 = false;
        in_R8D = CURLPX_OK;
      }
      else {
        bVar22 = true;
        if (sx->state != CONNECT_RESOLVED) {
          sx->state = CONNECT_RESOLVED;
        }
      }
LAB_0072c75b:
      if (bVar22) goto switchD_0072c2a3_caseD_b;
      goto LAB_0072ca23;
    default:
      goto switchD_0072c2a3_caseD_2;
    case CONNECT_SOCKS_READ:
      goto switchD_0072c2a3_caseD_4;
    case CONNECT_REQ_INIT:
      goto switchD_0072c2a3_caseD_9;
    case CONNECT_RESOLVING:
      goto switchD_0072c2a3_caseD_a;
    case CONNECT_RESOLVED:
      goto switchD_0072c2a3_caseD_b;
    case CONNECT_REQ_SENDING:
      goto switchD_0072c2a3_caseD_e;
    }
  case '\x05':
  case '\a':
    pcVar18 = sx->hostname;
    CVar19 = in_R8D;
    __n = strlen(pcVar18);
    bVar3 = (data->set).socks5auth;
    dns = (Curl_dns_entry *)0x0;
    sVar20 = 0;
    if (0xf < sx->state - CONNECT_SOCKS_INIT) goto switchD_0072c3c3_caseD_5;
    puVar1 = sx->buffer;
    in_R8D = CVar19;
    switch(sx->state) {
    case CONNECT_SOCKS_INIT:
      if (((data != (Curl_easy *)0x0) && (((uint)pcVar4->bits & 1) != 0)) &&
         (((data->set).field_0x8bd & 0x10) != 0)) {
        Curl_infof(data,"SOCKS5: connecting to HTTP proxy %s port %d",pcVar18,
                   (ulong)(uint)sx->remote_port);
      }
      if ((uVar2 == '\x05') || (__n < 0x100)) {
        if (((bVar3 & 0xfa) != 0 && data != (Curl_easy *)0x0) &&
           (((data->set).field_0x8bd & 0x10) != 0)) {
          Curl_infof(data,"warning: unsupported value passed to CURLOPT_SOCKS5_AUTH: %u",
                     (ulong)bVar3);
        }
        if ((bVar3 & 1) == 0) {
          sx->proxy_user = (char *)0x0;
        }
        sx->buffer[0] = '\x05';
        sx->buffer[2] = '\0';
        if (sx->proxy_user == (char *)0x0) {
          sVar14 = 3;
        }
        else {
          sx->buffer[3] = '\x02';
          sVar14 = 4;
        }
        sx->buffer[1] = (char)sVar14 + 0xfe;
        sx->outp = puVar1;
        sx->outstanding = sVar14;
        in_R8D = socks_state_send(cf,sx,data,CURLPX_SEND_CONNECT,"initial SOCKS5 request");
        if (in_R8D != CURLPX_OK) goto LAB_0072d4a3;
        if (sx->outstanding == 0) {
          if (sx->state != CONNECT_SOCKS_READ) {
            sx->state = CONNECT_SOCKS_READ;
          }
          goto switchD_0072c3c3_caseD_3;
        }
        goto LAB_0072d49c;
      }
      Curl_failf(data,
                 "SOCKS5: the destination hostname is too long to be resolved remotely by the proxy."
                );
      in_R8D = CURLPX_LONG_HOSTNAME;
      goto LAB_0072d4a3;
    case CONNECT_SOCKS_SEND:
      in_R8D = socks_state_send(cf,sx,data,CURLPX_SEND_CONNECT,"initial SOCKS5 request");
      if (in_R8D != CURLPX_OK) goto LAB_0072d4a3;
      if (sx->outstanding == 0) goto switchD_0072c3c3_caseD_3;
      goto LAB_0072d4fb;
    case CONNECT_SOCKS_READ_INIT:
switchD_0072c3c3_caseD_3:
      sx->outstanding = 2;
      sx->outp = puVar1;
    case CONNECT_SOCKS_READ:
      CVar19 = 0x9965a3;
      in_R8D = socks_state_recv(cf,sx,data,CURLPX_RECV_CONNECT,"initial SOCKS5 response");
      if (in_R8D != CURLPX_OK) goto LAB_0072d4a3;
      if (sx->outstanding != 0) goto LAB_0072d49c;
      if (*puVar1 != '\x05') {
        pcVar18 = "Received invalid version in initial SOCKS5 response.";
        goto LAB_0072d3b7;
      }
      bVar3 = sx->buffer[1];
      if (1 < bVar3) {
        if (bVar3 != 2) {
          if (bVar3 != 0xff) goto LAB_0072cc83;
          Curl_failf(data,"No authentication method was acceptable.");
          in_R8D = CURLPX_NO_AUTH;
          goto LAB_0072d4a3;
        }
        if (sx->state != CONNECT_AUTH_INIT) {
          sx->state = CONNECT_AUTH_INIT;
        }
switchD_0072c3c3_caseD_6:
        pcVar18 = sx->proxy_user;
        if ((pcVar18 == (char *)0x0) || (pcVar17 = sx->proxy_password, pcVar17 == (char *)0x0)) {
          __n_00 = 0;
          uVar15 = 0;
        }
        else {
          local_98 = strlen(pcVar18);
          __n_00 = strlen(pcVar17);
          uVar15 = local_98;
        }
        sx->buffer[0] = '\x01';
        sx->buffer[1] = (uchar)uVar15;
        if (uVar15 == 0 || pcVar18 == (char *)0x0) {
LAB_0072cd9b:
          CVar19 = (CURLproxycode)pcVar18;
          sx->buffer[uVar15 + 2] = (uchar)__n_00;
          sVar20 = uVar15 + 3;
          if (__n_00 != 0 && sx->proxy_password != (char *)0x0) {
            local_98 = sVar20;
            if (0xff < __n_00) {
              Curl_failf(data,"Excessive password length for proxy auth");
              CVar19 = CURLPX_LONG_PASSWD;
              sVar20 = local_98;
              goto LAB_0072ce03;
            }
            memcpy(puVar1 + sVar20,sx->proxy_password,__n_00);
            sVar20 = local_98;
          }
          sVar20 = sVar20 + __n_00;
          if (sx->state != CONNECT_AUTH_SEND) {
            sx->state = CONNECT_AUTH_SEND;
          }
          sx->outstanding = sVar20;
          sx->outp = puVar1;
          bVar22 = true;
        }
        else {
          if (uVar15 < 0x100) {
            local_98 = uVar15;
            memcpy(sx->buffer + 2,pcVar18,uVar15);
            uVar15 = local_98;
            goto LAB_0072cd9b;
          }
          Curl_failf(data,"Excessive user name length for proxy auth");
          CVar19 = CURLPX_LONG_USER;
          sVar20 = 2;
LAB_0072ce03:
          bVar22 = false;
        }
        in_R8D = CVar19;
        if (!bVar22) goto LAB_0072d4a3;
switchD_0072c3c3_caseD_7:
        local_98 = sVar20;
        in_R8D = socks_state_send(cf,sx,data,CURLPX_SEND_AUTH,"SOCKS5 sub-negotiation request");
        if (in_R8D != CURLPX_OK) goto LAB_0072d4a3;
        if (sx->outstanding == 0) {
          sx->outp = puVar1;
          sx->outstanding = 2;
          sVar20 = local_98;
          if (sx->state != CONNECT_AUTH_READ) {
            sx->state = CONNECT_AUTH_READ;
          }
switchD_0072c3c3_caseD_8:
          local_98 = sVar20;
          in_R8D = socks_state_recv(cf,sx,data,CURLPX_RECV_AUTH,"SOCKS5 sub-negotiation response");
          if (in_R8D == CURLPX_OK) {
            if (sx->outstanding != 0) goto LAB_0072d49c;
            if (sx->buffer[1] == '\0') {
              cVar12 = sx->state;
              sVar20 = local_98;
              goto joined_r0x0072cf42;
            }
            Curl_failf(data,"User was rejected by the SOCKS5 server (%d %d).",(ulong)*puVar1);
            in_R8D = CURLPX_USER_REJECTED;
          }
          goto LAB_0072d4a3;
        }
        goto LAB_0072d4fb;
      }
      if (bVar3 == 0) {
        sVar20 = 0;
        cVar12 = sx->state;
joined_r0x0072cf42:
        if (cVar12 != CONNECT_REQ_INIT) {
          sx->state = CONNECT_REQ_INIT;
        }
switchD_0072c3c3_caseD_9:
        in_R8D = CVar19;
        if (uVar2 == '\x05') {
          rVar11 = Curl_resolv(data,sx->hostname,sx->remote_port,true,&dns);
          if (rVar11 == CURLRESOLV_ERROR) {
            CVar19 = CURLPX_RESOLVE_HOST;
            bVar22 = false;
          }
          else {
            bVar22 = rVar11 != CURLRESOLV_PENDING;
            if (bVar22) {
              cVar12 = CONNECT_RESOLVED;
              bVar23 = sx->state == CONNECT_RESOLVED;
            }
            else {
              cVar12 = CONNECT_RESOLVING;
              bVar23 = sx->state == CONNECT_RESOLVING;
              CVar19 = CURLPX_OK;
            }
            if (!bVar23) {
              sx->state = cVar12;
            }
          }
          in_R8D = CVar19;
          if (bVar22) break;
          goto LAB_0072d4a3;
        }
switchD_0072c3c3_caseD_c:
        sx->buffer[0] = '\x05';
        sx->buffer[1] = '\x01';
        sx->buffer[2] = '\0';
        sVar20 = 3;
        if (uVar2 != '\x05') {
          if (((pcVar4->bits).field_0x1 & 8) == 0) {
            iVar10 = inet_pton(2,sx->hostname,ip4);
            if (iVar10 == 1) {
              sx->buffer[3] = '\x01';
              *(uchar (*) [4])(sx->buffer + 4) = ip4;
              sVar20 = 8;
            }
            else {
              sx->buffer[3] = '\x03';
              sx->buffer[4] = (uchar)__n;
              memcpy(sx->buffer + 5,sx->hostname,__n);
              sVar20 = __n + 5;
            }
LAB_0072d08a:
            bVar22 = true;
            if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
              Curl_infof(data,"SOCKS5 connect to %s:%d (remotely resolved)",sx->hostname,
                         (ulong)(uint)sx->remote_port);
            }
          }
          else {
            iVar10 = inet_pton(10,sx->hostname,ip4);
            if (iVar10 == 1) {
              sx->buffer[3] = '\x04';
              *(ulong *)(sx->buffer + 4) = CONCAT44(uStack_74,ip4);
              *(undefined8 *)(sx->buffer + 0xc) = uStack_70;
              sVar20 = 0x14;
              goto LAB_0072d08a;
            }
            in_R8D = CURLPX_BAD_ADDRESS_TYPE;
            sVar20 = 3;
            bVar22 = false;
          }
          if (!bVar22) goto LAB_0072d4a3;
        }
        goto switchD_0072c3c3_caseD_d;
      }
      if (bVar3 == 1) {
        Curl_failf(data,"SOCKS5 GSSAPI per-message authentication is not supported.");
        in_R8D = CURLPX_GSSAPI_PERMSG;
      }
      else {
LAB_0072cc83:
        Curl_failf(data,"Undocumented SOCKS5 mode attempted to be used by server.");
        in_R8D = CURLPX_UNKNOWN_MODE;
      }
      goto LAB_0072d4a3;
    case CONNECT_GSSAPI_INIT:
      goto switchD_0072c3c3_caseD_5;
    case CONNECT_AUTH_INIT:
      goto switchD_0072c3c3_caseD_6;
    case CONNECT_AUTH_SEND:
      goto switchD_0072c3c3_caseD_7;
    case CONNECT_AUTH_READ:
      goto switchD_0072c3c3_caseD_8;
    case CONNECT_REQ_INIT:
      goto switchD_0072c3c3_caseD_9;
    case CONNECT_RESOLVING:
      dns = Curl_fetch_addr(data,pcVar18,sx->remote_port);
      if (((data != (Curl_easy *)0x0) && (dns != (Curl_dns_entry *)0x0)) &&
         (((data->set).field_0x8bd & 0x10) != 0)) {
        Curl_infof(data,"SOCKS5: hostname \'%s\' found",sx->hostname);
      }
      if (dns == (Curl_dns_entry *)0x0) {
        CVar8 = Curl_resolv_check(data,&dns);
        if (dns == (Curl_dns_entry *)0x0) {
          in_R8D = CURLPX_RESOLVE_HOST;
          if (CVar8 == CURLE_OK) {
            in_R8D = CURLPX_OK;
          }
          goto LAB_0072d4a3;
        }
        sVar20 = 0;
      }
      else {
        sVar20 = 0;
      }
      break;
    case CONNECT_RESOLVE_REMOTE:
      goto switchD_0072c3c3_caseD_c;
    case CONNECT_REQ_SEND:
      goto switchD_0072c3c3_caseD_d;
    case CONNECT_REQ_SENDING:
      goto switchD_0072c3c3_caseD_e;
    case CONNECT_REQ_READ:
      goto switchD_0072c3c3_caseD_f;
    case CONNECT_REQ_READ_MORE:
      goto switchD_0072c3c3_caseD_10;
    }
    if (dns == (Curl_dns_entry *)0x0) {
      pCVar16 = (Curl_addrinfo *)0x0;
    }
    else {
      pCVar16 = dns->addr;
    }
    uVar2 = (data->set).ipver;
    if ((uVar2 != '\0') && (pCVar16 != (Curl_addrinfo *)0x0)) {
      do {
        if (pCVar16->ai_family == (uint)(uVar2 != '\x01') * 8 + 2) break;
        pCVar16 = pCVar16->ai_next;
      } while (pCVar16 != (Curl_addrinfo *)0x0);
    }
    if (pCVar16 == (Curl_addrinfo *)0x0) {
      Curl_failf(data,"Failed to resolve \"%s\" for SOCKS5 connect.",sx->hostname);
      CVar19 = CURLPX_RESOLVE_HOST;
    }
    else {
      Curl_printable_address(pCVar16,(char *)ip4,0x2e);
      sx->buffer[0] = '\x05';
      sx->buffer[1] = '\x01';
      sx->buffer[2] = '\0';
      if (pCVar16->ai_family == 10) {
        sx->buffer[3] = '\x04';
        psVar5 = pCVar16->ai_addr;
        lVar13 = 0;
        do {
          sx->buffer[lVar13 + 4] = psVar5->sa_data[lVar13 + 6];
          lVar13 = lVar13 + 1;
        } while (lVar13 != 0x10);
        sVar20 = 0x14;
        if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
          uVar9 = sx->remote_port;
          pcVar18 = "SOCKS5 connect to [%s]:%d (locally resolved)";
LAB_0072d252:
          Curl_infof(data,pcVar18,ip4,(ulong)uVar9);
        }
      }
      else if (pCVar16->ai_family == 2) {
        sx->buffer[3] = '\x01';
        psVar5 = pCVar16->ai_addr;
        lVar13 = 0;
        do {
          sx->buffer[lVar13 + 4] = psVar5->sa_data[lVar13 + 2];
          lVar13 = lVar13 + 1;
        } while (lVar13 != 4);
        sVar20 = 8;
        if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
          uVar9 = sx->remote_port;
          pcVar18 = "SOCKS5 connect to %s:%d (locally resolved)";
          goto LAB_0072d252;
        }
      }
      else {
        Curl_failf(data,"SOCKS5 connection to %s not supported",ip4);
        sVar20 = 3;
      }
      Curl_resolv_unlock(data,dns);
    }
    in_R8D = CVar19;
    if (pCVar16 != (Curl_addrinfo *)0x0) {
switchD_0072c3c3_caseD_d:
      sx->buffer[sVar20] = *(uchar *)((long)&sx->remote_port + 1);
      sx->buffer[sVar20 + 1] = (uchar)sx->remote_port;
      sx->outp = puVar1;
      sx->outstanding = sVar20 + 2;
      if (sx->state != CONNECT_REQ_SENDING) {
        sx->state = CONNECT_REQ_SENDING;
      }
switchD_0072c3c3_caseD_e:
      in_R8D = socks_state_send(cf,sx,data,CURLPX_SEND_REQUEST,"SOCKS5 connect request");
      if (in_R8D == CURLPX_OK) {
        if (sx->outstanding == 0) {
          sx->outstanding = 10;
          sx->outp = puVar1;
          if (sx->state != CONNECT_REQ_READ) {
            sx->state = CONNECT_REQ_READ;
          }
switchD_0072c3c3_caseD_f:
          in_R8D = socks_state_recv(cf,sx,data,CURLPX_RECV_REQACK,"SOCKS5 connect request ack");
          if (in_R8D == CURLPX_OK) {
            if (sx->outstanding != 0) goto LAB_0072d49c;
            if (*puVar1 == '\x05') {
              bVar3 = sx->buffer[1];
              if (bVar3 == 0) {
                uVar2 = sx->buffer[3];
                if (uVar2 == '\x01') {
                  lVar13 = 10;
                }
                else if (uVar2 == '\x04') {
                  lVar13 = 0x16;
                }
                else {
                  if (uVar2 != '\x03') {
                    Curl_failf(data,"SOCKS5 reply has wrong address type.");
                    cf = local_90;
                    in_R8D = CURLPX_BAD_ADDRESS_TYPE;
                    goto LAB_0072d4a3;
                  }
                  lVar13 = (ulong)sx->buffer[4] + 7;
                }
                cf = local_90;
                if ((uint)lVar13 < 0xb) {
                  cVar12 = sx->state;
                }
                else {
                  sx->outstanding = lVar13 + -10;
                  sx->outp = sx->buffer + 10;
                  if (sx->state != CONNECT_REQ_READ_MORE) {
                    sx->state = CONNECT_REQ_READ_MORE;
                  }
switchD_0072c3c3_caseD_10:
                  in_R8D = socks_state_recv(cf,sx,data,CURLPX_RECV_ADDRESS,
                                            "SOCKS5 connect request address");
                  if (in_R8D != CURLPX_OK) goto LAB_0072d4a3;
                  if (sx->outstanding != 0) goto LAB_0072d49c;
                  cVar12 = sx->state;
                }
                if (cVar12 != CONNECT_DONE) {
                  sx->state = CONNECT_DONE;
                }
switchD_0072c3c3_caseD_5:
                if (data == (Curl_easy *)0x0) {
LAB_0072d4fb:
                  in_R8D = CURLPX_OK;
                }
                else {
                  in_R8D = CURLPX_OK;
                  if (((data->set).field_0x8bd & 0x10) != 0) {
                    Curl_infof(data,"SOCKS5 request granted.");
                    goto LAB_0072d49c;
                  }
                }
              }
              else {
                Curl_failf(data,"Can\'t complete SOCKS5 connection to %s. (%d)",sx->hostname,
                           (ulong)bVar3);
                in_R8D = CURLPX_REPLY_UNASSIGNED;
                if (bVar3 < 9) {
                  in_R8D = *(CURLproxycode *)(do_SOCKS5_lookup + (ulong)bVar3 * 4);
                }
              }
            }
            else {
              pcVar18 = "SOCKS5 reply has wrong version, version should be 5.";
LAB_0072d3b7:
              Curl_failf(data,pcVar18);
              in_R8D = CURLPX_BAD_VERSION;
            }
          }
        }
        else {
LAB_0072d49c:
          in_R8D = CURLPX_OK;
        }
      }
    }
LAB_0072d4a3:
    CVar8 = CURLE_OK;
    break;
  default:
    Curl_failf(data,"unknown proxytype option given");
    in_R8D = CURLPX_OK;
    CVar8 = CURLE_COULDNT_CONNECT;
  }
LAB_0072d4a5:
  if (in_R8D != CURLPX_OK) {
    (data->info).pxcode = in_R8D;
    CVar8 = CURLE_PROXY;
  }
  if ((CVar8 == CURLE_OK) && (sx->state == CONNECT_DONE)) {
    cf->field_0x24 = cf->field_0x24 | 1;
    Curl_verboseconnect(data,local_88);
    if (cf->ctx != (void *)0x0) {
      (*Curl_cfree)(cf->ctx);
      cf->ctx = (void *)0x0;
    }
  }
  _Var6 = (_Bool)(cf->field_0x24 & 1);
LAB_0072c210:
  *local_80 = _Var6;
  return CVar8;
switchD_0072c2a3_caseD_a:
  dns = Curl_fetch_addr(data,sx->hostname,pcVar4->port);
  if (dns == (Curl_dns_entry *)0x0) {
    CVar8 = Curl_resolv_check(data,&dns);
    if (dns == (Curl_dns_entry *)0x0) {
      in_R8D = CURLPX_RESOLVE_HOST;
      if (CVar8 == CURLE_OK) {
        in_R8D = CURLPX_OK;
      }
      goto LAB_0072ca23;
    }
  }
  else {
    if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
      Curl_infof(data,"Hostname \'%s\' was found",sx->hostname);
    }
    if (sx->state != CONNECT_RESOLVED) {
      sx->state = CONNECT_RESOLVED;
    }
  }
switchD_0072c2a3_caseD_b:
  if (dns == (Curl_dns_entry *)0x0) {
    pcVar18 = sx->hostname;
    pcVar17 = "Failed to resolve \"%s\" for SOCKS4 connect.";
  }
  else {
    for (pCVar16 = dns->addr; pCVar16 != (Curl_addrinfo *)0x0; pCVar16 = pCVar16->ai_next) {
      if (pCVar16->ai_family == 2) {
        Curl_printable_address(pCVar16,(char *)ip4,0x40);
        psVar5 = pCVar16->ai_addr;
        sx->buffer[4] = psVar5->sa_data[2];
        sx->buffer[5] = psVar5->sa_data[3];
        sx->buffer[6] = psVar5->sa_data[4];
        sx->buffer[7] = psVar5->sa_data[5];
        if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
          Curl_infof(data,"SOCKS4 connect to IPv4 %s (locally resolved)",ip4);
        }
        Curl_resolv_unlock(data,dns);
        bVar22 = false;
        goto LAB_0072c7ba;
      }
    }
    pcVar18 = sx->hostname;
    pcVar17 = "SOCKS4 connection to %s not supported";
  }
  Curl_failf(data,pcVar17,pcVar18);
  bVar22 = true;
LAB_0072c7ba:
  if (bVar22) {
    in_R8D = CURLPX_RESOLVE_HOST;
  }
  else {
switchD_0072c2a3_caseD_9:
    sx->buffer[8] = '\0';
    pcVar18 = sx->proxy_user;
    if (pcVar18 != (char *)0x0) {
      sVar20 = strlen(pcVar18);
      if (0xff < sVar20) {
        Curl_failf(data,"Too long SOCKS proxy user name");
        in_R8D = CURLPX_LONG_USER;
        cf = local_90;
        goto LAB_0072ca23;
      }
      memcpy(sx->buffer + 8,pcVar18,sVar20 + 1);
    }
    sVar20 = strlen((char *)(sx->buffer + 8));
    uVar15 = sVar20 + 9;
    if (uVar2 == '\x06') {
      sx->buffer[4] = '\0';
      sx->buffer[5] = '\0';
      sx->buffer[6] = '\0';
      sx->buffer[7] = '\x01';
      pcVar18 = sx->hostname;
      sVar20 = strlen(pcVar18);
      if ((sVar20 + 1 < 0x100) && (uVar21 = sVar20 + 1 + uVar15, uVar21 < 600)) {
        strcpy((char *)(puVar1 + uVar15),pcVar18);
        bVar22 = true;
        uVar15 = uVar21;
      }
      else {
        bVar22 = false;
        Curl_failf(data,"SOCKS4: too long host name");
        in_R8D = CURLPX_LONG_HOSTNAME;
      }
      if (bVar22) goto LAB_0072c8da;
      bVar22 = false;
    }
    else {
LAB_0072c8da:
      sx->outp = puVar1;
      sx->outstanding = uVar15;
      bVar22 = true;
      if (sx->state != CONNECT_REQ_SENDING) {
        sx->state = CONNECT_REQ_SENDING;
      }
    }
    cf = local_90;
    if (bVar22) {
switchD_0072c2a3_caseD_e:
      in_R8D = socks_state_send(cf,sx,data,CURLPX_SEND_CONNECT,"SOCKS4 connect request");
      if (in_R8D == CURLPX_OK) {
        if (sx->outstanding == 0) {
          sx->outstanding = 8;
          sx->outp = puVar1;
          if (sx->state != CONNECT_SOCKS_READ) {
            sx->state = CONNECT_SOCKS_READ;
          }
switchD_0072c2a3_caseD_4:
          in_R8D = socks_state_recv(cf,sx,data,CURLPX_RECV_CONNECT,"connect request ack");
          if (in_R8D == CURLPX_OK) {
            if (sx->outstanding != 0) goto LAB_0072c97e;
            if (sx->state != CONNECT_DONE) {
              sx->state = CONNECT_DONE;
            }
switchD_0072c2a3_caseD_2:
            if (*puVar1 == '\0') {
              switch(sx->buffer[1]) {
              case 'Z':
                in_R8D = CURLPX_OK;
                if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
                  pcVar18 = "";
                  if (uVar2 == '\x06') {
                    pcVar18 = "a";
                  }
                  Curl_infof(data,"SOCKS4%s request granted.",pcVar18);
                  goto LAB_0072c97e;
                }
                break;
              case '[':
                Curl_failf(data,
                           "Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected or failed."
                           ,(ulong)sx->buffer[4],(ulong)sx->buffer[5],(ulong)sx->buffer[6],
                           (ulong)sx->buffer[7],
                           (ulong)(ushort)(*(ushort *)(sx->buffer + 2) << 8 |
                                          *(ushort *)(sx->buffer + 2) >> 8),0x5b);
                in_R8D = CURLPX_REQUEST_FAILED;
                break;
              case '\\':
                Curl_failf(data,
                           "Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected because SOCKS server cannot connect to identd on the client."
                           ,(ulong)sx->buffer[4],(ulong)sx->buffer[5],(ulong)sx->buffer[6],
                           (ulong)sx->buffer[7],
                           (ulong)(ushort)(*(ushort *)(sx->buffer + 2) << 8 |
                                          *(ushort *)(sx->buffer + 2) >> 8),0x5c);
                in_R8D = CURLPX_IDENTD;
                break;
              case ']':
                Curl_failf(data,
                           "Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected because the client program and identd report different user-ids."
                           ,(ulong)sx->buffer[4],(ulong)sx->buffer[5],(ulong)sx->buffer[6],
                           (ulong)sx->buffer[7],
                           (ulong)(ushort)(*(ushort *)(sx->buffer + 2) << 8 |
                                          *(ushort *)(sx->buffer + 2) >> 8),0x5d);
                in_R8D = CURLPX_IDENTD_DIFFER;
                break;
              default:
                Curl_failf(data,
                           "Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), Unknown.",
                           (ulong)sx->buffer[4],(ulong)sx->buffer[5],(ulong)sx->buffer[6],
                           (ulong)sx->buffer[7],
                           (ulong)(ushort)(*(ushort *)(sx->buffer + 2) << 8 |
                                          *(ushort *)(sx->buffer + 2) >> 8),(ulong)sx->buffer[1]);
                in_R8D = CURLPX_UNKNOWN_FAIL;
              }
            }
            else {
              Curl_failf(data,"SOCKS4 reply has wrong version, version should be 0.");
              in_R8D = CURLPX_BAD_VERSION;
            }
          }
        }
        else {
LAB_0072c97e:
          in_R8D = CURLPX_OK;
        }
      }
    }
  }
LAB_0072ca23:
  CVar8 = CURLE_OK;
  goto LAB_0072d4a5;
}

Assistant:

static CURLcode socks_proxy_cf_connect(struct Curl_cfilter *cf,
                                       struct Curl_easy *data,
                                       bool blocking, bool *done)
{
  CURLcode result;
  struct connectdata *conn = cf->conn;
  int sockindex = cf->sockindex;
  struct socks_state *sx = cf->ctx;

  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  result = cf->next->cft->do_connect(cf->next, data, blocking, done);
  if(result || !*done)
    return result;

  if(!sx) {
    sx = calloc(1, sizeof(*sx));
    if(!sx)
      return CURLE_OUT_OF_MEMORY;
    cf->ctx = sx;
  }

  if(sx->state == CONNECT_INIT) {
    /* for the secondary socket (FTP), use the "connect to host"
     * but ignore the "connect to port" (use the secondary port)
     */
    sxstate(sx, data, CONNECT_SOCKS_INIT);
    sx->hostname =
      conn->bits.httpproxy ?
      conn->http_proxy.host.name :
      conn->bits.conn_to_host ?
      conn->conn_to_host.name :
      sockindex == SECONDARYSOCKET ?
      conn->secondaryhostname : conn->host.name;
    sx->remote_port =
      conn->bits.httpproxy ? (int)conn->http_proxy.port :
      sockindex == SECONDARYSOCKET ? conn->secondary_port :
      conn->bits.conn_to_port ? conn->conn_to_port :
      conn->remote_port;
    sx->proxy_user = conn->socks_proxy.user;
    sx->proxy_password = conn->socks_proxy.passwd;
  }

  result = connect_SOCKS(cf, sx, data);
  if(!result && sx->state == CONNECT_DONE) {
    cf->connected = TRUE;
    Curl_verboseconnect(data, conn);
    socks_proxy_cf_free(cf);
  }

  *done = cf->connected;
  return result;
}